

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
  *this;
  char *__lhs;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
  __l;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  long *plVar4;
  reference ppVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *t_00;
  runtime_error *this_00;
  rep rVar6;
  long lVar7;
  undefined1 auVar8 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  *local_3f0;
  bool local_3c1;
  exception *e;
  duration<long,_std::ratio<1L,_1000L>_> e_1;
  int local_394;
  undefined1 local_390 [4];
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v_1;
  timer t_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
  *__range1;
  int local_344;
  duration<long,_std::ratio<1L,_1L>_> local_340;
  type_conflict local_338;
  long local_330;
  long n_times;
  undefined1 local_320 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  timer t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reference;
  size_t file_size;
  microseconds reference_time;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2d0;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2c8;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2c0;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2b8;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2b0;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2a8;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_2a0;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_298;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_290;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_288;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_280;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_278;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  *local_270;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_240;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_150;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_b0;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
  tests;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  char *pcStack_20;
  bool check;
  char *file_name;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file_name = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Pass a filename to read\n");
    argv_local._4_4_ = 1;
  }
  else {
    pcStack_20 = argv[1];
    tests.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    local_3c1 = false;
    if (2 < argc) {
      __lhs = argv[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"check",&local_49);
      tests.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      local_3c1 = std::operator==(__lhs,&local_48);
    }
    if ((tests.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (2 < argc) {
      std::allocator<char>::~allocator(&local_49);
    }
    local_21 = local_3c1;
    local_270 = &local_268;
    local_278 = anon_unknown.dwarf_c1df::read_stdio_inc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[23],_true>(local_270,(char (*) [23])"stdio incremental read",&local_278);
    local_270 = &local_240;
    local_280 = anon_unknown.dwarf_c1df::read_modern_inc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[28],_true>
              (local_270,(char (*) [28])"modern::io incremental read",&local_280);
    local_270 = &local_218;
    local_288 = anon_unknown.dwarf_c1df::read_stdio_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[24],_true>(local_270,(char (*) [24])"stdio preallocated read",&local_288);
    local_270 = &local_1f0;
    local_290 = anon_unknown.dwarf_c1df::read_iostream_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[27],_true>
              (local_270,(char (*) [27])"iostream preallocated read",&local_290);
    local_270 = &local_1c8;
    local_298 = anon_unknown.dwarf_c1df::read_modern_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[29],_true>
              (local_270,(char (*) [29])"modern::io preallocated read",&local_298);
    local_270 = &local_1a0;
    local_2a0 = anon_unknown.dwarf_c1df::read_modern_mmap_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[34],_true>
              (local_270,(char (*) [34])"modern::io preallocated mmap read",&local_2a0);
    local_270 = &local_178;
    local_2a8 = anon_unknown.dwarf_c1df::read_iostream_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[32],_true>
              (local_270,(char (*) [32])"iostream incremental range read",&local_2a8);
    local_270 = &local_150;
    local_2b0 = anon_unknown.dwarf_c1df::read_modern_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[34],_true>
              (local_270,(char (*) [34])"modern::io incremental range read",&local_2b0);
    local_270 = &local_128;
    local_2b8 = anon_unknown.dwarf_c1df::read_modern_mmap_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[39],_true>
              (local_270,(char (*) [39])"modern::io incremental mmap range read",&local_2b8);
    local_270 = &local_100;
    local_2c0 = anon_unknown.dwarf_c1df::read_iostream_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[33],_true>
              (local_270,(char (*) [33])"iostream preallocated range read",&local_2c0);
    local_270 = &local_d8;
    local_2c8 = anon_unknown.dwarf_c1df::read_modern_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[35],_true>
              (local_270,(char (*) [35])"modern::io preallocated range read",&local_2c8);
    local_270 = &local_b0;
    local_2d0 = anon_unknown.dwarf_c1df::read_modern_mmap_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[40],_true>
              (local_270,(char (*) [40])"modern::io preallocated mmap range read",&local_2d0);
    local_88 = &local_268;
    local_80 = 0xc;
    this = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
            *)((long)&reference_time.__r + 7);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
    ::allocator(this);
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
              *)local_78,__l,this);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
                  *)((long)&reference_time.__r + 7));
    local_3f0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
                 *)&local_88;
    do {
      local_3f0 = local_3f0 + -1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
      ::~pair(local_3f0);
    } while (local_3f0 != &local_268);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t);
    poVar2 = std::operator<<((ostream *)&std::cout,"warming cache and checking disk speed... ");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown.dwarf_c1df::timer::timer
              ((timer *)&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_c1df::read_stdio_inc
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320,pcStack_20);
    n_times = (long)(anonymous_namespace)::timer::
                    elapsed<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                              ((timer *)&v.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    file_size = n_times;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
    if ((local_21 & 1) != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
    }
    std::operator<<((ostream *)&std::cout,"done\n");
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
    local_344 = 2;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_340,&local_344);
    local_338 = std::chrono::operator/
                          (&local_340,(duration<long,_std::ratio<1L,_1000000L>_> *)&file_size);
    __range1 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                *)0x1;
    plVar4 = std::max<long>(&local_338,(long *)&__range1);
    local_330 = *plVar4;
    poVar2 = std::operator<<((ostream *)&std::cout,"Performing ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_330);
    poVar2 = std::operator<<(poVar2," read(s) of ");
    poVar2 = std::operator<<(poVar2,pcStack_20);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," bytes, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3 * local_330);
    poVar2 = std::operator<<(poVar2," total) per test");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __end1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                      *)local_78);
    test = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                     *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>_>
                                       *)&test), bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>_>
               ::operator*(&__end1);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)ppVar5);
      std::operator<<(poVar2," ");
      memset(&v_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,8);
      anon_unknown.dwarf_c1df::timer::timer
                ((timer *)&v_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
      for (local_394 = 0; local_394 < local_330; local_394 = local_394 + 1) {
        (*ppVar5->second)((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&e_1,pcStack_20);
        t_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&e_1);
        io::black_box<std::vector<unsigned_char,std::allocator<unsigned_char>>&>(t_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&e_1);
      }
      e = (exception *)
          (anonymous_namespace)::timer::elapsed<std::chrono::duration<long,std::ratio<1l,1000l>>>
                    ((timer *)&v_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((local_21 & 1) != 0) &&
         (bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390
                                  ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t),
         bVar1)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"read does not match reference output");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"took ");
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&e);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar6);
      poVar2 = std::operator<<(poVar2,"ms (");
      lVar7 = local_330 * sVar3;
      auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = 0x45300000;
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&e);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar8._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                                 ((double)rVar6 * 1000.0));
      std::operator<<(poVar2,"MB/s)\n");
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>_>
      ::operator++(&__end1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
               *)local_78);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Pass a filename to read\n";
        return 1;
    }

    auto file_name = argv[1];
    const bool check = argc > 2 && argv[2] == std::string("check");

    using test_entry = std::pair<std::string, std::vector<std::uint8_t>(*)(const char*)>;
#ifdef _POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "modern::io preallocated mmap read", read_modern_mmap_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "modern::io incremental mmap range read", read_modern_mmap_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
            { "modern::io preallocated mmap range read", read_modern_mmap_range_prealloc },
    };
#else // !_POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
    };
#endif // _POSIX_VERSION

    std::chrono::microseconds reference_time;
    std::size_t file_size = 0;

    std::vector<uint8_t> reference;
    {
        std::cout << "warming cache and checking disk speed... " << std::flush;
        timer t{};
        auto v = read_stdio_inc(file_name);
        reference_time = t.elapsed<std::chrono::microseconds>();
        file_size = v.size();
        if (check) {
            reference = std::move(v);
        }
        std::cout << "done\n";
    }

    // A good heuristic for meaningful results seems to be to make the fastest
    // tests take ~2 seconds
    auto n_times = std::max<long>(std::chrono::seconds{2}/reference_time, 1);

    std::cout << "Performing " << n_times << " read(s) of "
              << file_name << " (" << file_size << " bytes, "
              << file_size * n_times << " total) per test" << std::endl;

    for (const auto& test : tests) {
        std::cout << test.first << " ";
        try {
            auto t = timer{};
            std::vector<std::uint8_t> v;
            for (int i = 0; i < n_times; i++) {
                io::black_box(v = test.second(file_name));
            }
            auto e = t.elapsed();
            if (check && v != reference) {
                throw std::runtime_error{"read does not match reference output"};
            }
            std::cout << "took " << e.count() << "ms ("
                      << n_times * file_size/(1000.0 * e.count()) << "MB/s)\n";
        } catch (const std::exception& e){
            std::cout << "-- ERROR " << e.what() << "\n";
        }
    }
}